

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseDenseProduct.h
# Opt level: O2

void Eigen::internal::
     sparse_time_dense_product_impl<Eigen::SparseMatrix<float,_0,_int>,_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_float,_0,_true>
     ::run(SparseMatrix<float,_0,_int> *lhs,Matrix<float,__1,_1,_0,__1,_1> *rhs,
          Matrix<float,__1,_1,_0,__1,_1> *res,float *alpha)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  bool bVar4;
  Index j;
  long outer;
  long lVar5;
  long lStack_70;
  LhsInnerIterator it;
  
  bVar4 = true;
  lStack_70 = 0;
  while (bVar4) {
    for (outer = 0; outer < lhs->m_outerSize; outer = outer + 1) {
      fVar1 = *alpha;
      fVar2 = (rhs->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_data
              [(rhs->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_rows
               * lStack_70 + outer];
      SparseCompressedBase<Eigen::SparseMatrix<float,_0,_int>_>::InnerIterator::InnerIterator
                (&it,&lhs->super_SparseCompressedBase<Eigen::SparseMatrix<float,_0,_int>_>,outer);
      lVar5 = (res->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_rows
              * lStack_70;
      pfVar3 = (res->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      for (; it.m_id < it.m_end; it.m_id = it.m_id + 1) {
        pfVar3[lVar5 + it.m_indices[it.m_id]] =
             it.m_values[it.m_id] * fVar1 * fVar2 + pfVar3[lVar5 + it.m_indices[it.m_id]];
      }
    }
    bVar4 = false;
    lStack_70 = 1;
  }
  return;
}

Assistant:

static void run(const SparseLhsType& lhs, const DenseRhsType& rhs, DenseResType& res, const AlphaType& alpha)
  {
    LhsEval lhsEval(lhs);
    for(Index c=0; c<rhs.cols(); ++c)
    {
      for(Index j=0; j<lhs.outerSize(); ++j)
      {
//        typename Res::Scalar rhs_j = alpha * rhs.coeff(j,c);
        typename ScalarBinaryOpTraits<AlphaType, typename Rhs::Scalar>::ReturnType rhs_j(alpha * rhs.coeff(j,c));
        for(LhsInnerIterator it(lhsEval,j); it ;++it)
          res.coeffRef(it.index(),c) += it.value() * rhs_j;
      }
    }
  }